

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

void keccak_init(keccak_state *s,uint hashbits,uint ratebits,uchar first_pad_byte)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  
  if ((hashbits & 7) != 0) {
    __assert_fail("hashbits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x95,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  if ((ratebits & 7) != 0) {
    __assert_fail("ratebits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x96,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  s->hash_bytes = (ulong)(hashbits >> 3);
  uVar3 = 0x640 - ratebits >> 3;
  s->bytes_wanted = (ulong)uVar3;
  s->bytes_got = 0;
  s->first_pad_byte = first_pad_byte;
  auVar2 = _DAT_00184460;
  auVar1 = _DAT_00182240;
  if ((uVar3 & 7) != 0) {
    __assert_fail("s->bytes_wanted % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha3.c",
                  0x9d,"void keccak_init(keccak_state *, unsigned int, unsigned int, unsigned char)"
                 );
  }
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar6 = auVar1;
    do {
      if (SUB164(auVar6 ^ auVar2,4) == -0x80000000 && SUB164(auVar6 ^ auVar2,0) < -0x7ffffffb) {
        *(undefined8 *)((long)s->A[0] + lVar5) = 0;
        *(undefined8 *)((long)s->A[1] + lVar5) = 0;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x50;
    } while (lVar5 != 0xf0);
    lVar4 = lVar4 + 1;
    s = (keccak_state *)(s->A[0] + 1);
  } while (lVar4 != 5);
  return;
}

Assistant:

static void keccak_init(keccak_state *s, unsigned hashbits, unsigned ratebits,
                        unsigned char first_pad_byte)
{
    int x, y;

    assert(hashbits % 8 == 0);
    assert(ratebits % 8 == 0);

    s->hash_bytes = hashbits / 8;
    s->bytes_wanted = (25 * 64 - ratebits) / 8;
    s->bytes_got = 0;
    s->first_pad_byte = first_pad_byte;

    assert(s->bytes_wanted % 8 == 0);

    for (y = 0; y < 5; y++)
        for (x = 0; x < 5; x++)
            s->A[x][y] = 0;
}